

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O2

void __thiscall GraphSam::deleteNode(GraphSam *this,int value)

{
  const_iterator __position;
  
  __position._M_current =
       (this->m_nodes).
       super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->m_nodes).
        super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if ((((__position._M_current)->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        )->m_value == value) break;
    __position._M_current = __position._M_current + 1;
  }
  std::__shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(__position._M_current)->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::erase
            (&this->m_nodes,__position);
  return;
}

Assistant:

void GraphSam::deleteNode(int value) {

    for (auto iter = m_nodes.begin(); iter != m_nodes.end(); iter++) {
        if ((*iter)->getValue() == value) {
            iter->reset();
            m_nodes.erase(iter);
            return;
        }
    }

}